

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestStreamWriterTestdropNullPlaceholders::runTestCase
          (TestStreamWriterTestdropNullPlaceholders *this)

{
  bool bVar1;
  Value *pVVar2;
  char *in_RCX;
  string sStack_e8;
  Value nullValue;
  StreamWriterBuilder b;
  Value local_70;
  Value local_48;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&b);
  Json::Value::Value(&nullValue,nullValue);
  Json::Value::Value(&local_48,false);
  pVVar2 = Json::Value::operator[](&b.settings_,"dropNullPlaceholders");
  Json::Value::operator=(pVVar2,&local_48);
  Json::Value::~Value(&local_48);
  Json::writeString_abi_cxx11_(&sStack_e8,(Json *)&b,(Factory *)&nullValue,(Value *)in_RCX);
  bVar1 = std::operator==(&sStack_e8,"null");
  std::__cxx11::string::~string((string *)&sStack_e8);
  if (!bVar1) {
    in_RCX = "Json::writeString(b, nullValue) == \"null\"";
    JsonTest::TestResult::addFailure
              ((this->super_StreamWriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x679,"Json::writeString(b, nullValue) == \"null\"");
  }
  Json::Value::Value(&local_70,true);
  pVVar2 = Json::Value::operator[](&b.settings_,"dropNullPlaceholders");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::writeString_abi_cxx11_(&sStack_e8,(Json *)&b,(Factory *)&nullValue,(Value *)in_RCX);
  bVar1 = std::operator==(&sStack_e8,"");
  std::__cxx11::string::~string((string *)&sStack_e8);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_StreamWriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x67b,"Json::writeString(b, nullValue) == \"\"");
  }
  Json::Value::~Value(&nullValue);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, dropNullPlaceholders) {
  Json::StreamWriterBuilder b;
  Json::Value nullValue;
  b.settings_["dropNullPlaceholders"] = false;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "null");
  b.settings_["dropNullPlaceholders"] = true;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "");
}